

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

_ElementType * __thiscall
Lib::
CatIterator<Lib::VirtualIterator<Kernel::Substitution>,_Lib::IterTraits<Inferences::Instantiation::AllSubstitutionsIterator>_>
::next(_ElementType *__return_storage_ptr__,
      CatIterator<Lib::VirtualIterator<Kernel::Substitution>,_Lib::IterTraits<Inferences::Instantiation::AllSubstitutionsIterator>_>
      *this)

{
  hasNext(this);
  if (this->_first == true) {
    (*((this->_it1)._core)->_vptr_IteratorCore[3])(__return_storage_ptr__);
  }
  else {
    IterTraits<Inferences::Instantiation::AllSubstitutionsIterator>::next
              (__return_storage_ptr__,&this->_it2);
  }
  return __return_storage_ptr__;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }